

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.h
# Opt level: O0

void __thiscall
BCLog::Timer<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>::Log
          (Timer<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *this,string *msg)

{
  string_view source_file;
  string_view source_file_00;
  undefined1 uVar1;
  Timer<std::chrono::duration<long,_std::ratio<1L,_1L>_>_> *in_RDI;
  long in_FS_OFFSET;
  string_view in_stack_00000000;
  string full_msg;
  Level in_stack_000000e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_000000f0;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 in_stack_ffffffffffffff3c;
  char *in_stack_ffffffffffffff50;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5f;
  LogFlags in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffac;
  ConstevalFormatString<1U> in_stack_ffffffffffffffe8;
  size_t in_stack_fffffffffffffff0;
  char *pcVar2;
  
  pcVar2 = *(char **)(in_FS_OFFSET + 0x28);
  LogMsg(in_RDI,(string *)CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
  if (in_RDI->m_log_category == ALL) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58),
               in_stack_ffffffffffffff50);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)
               CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58),
               in_stack_ffffffffffffff50);
    in_stack_ffffffffffffff38 = 2;
    source_file._M_str = pcVar2;
    source_file._M_len = in_stack_fffffffffffffff0;
    LogPrintFormatInternal<std::__cxx11::string>
              (in_stack_00000000,source_file,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa0,
               in_stack_000000e0,in_stack_ffffffffffffffe8,in_stack_000000f0);
  }
  else {
    uVar1 = ::LogAcceptCategory(CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),Trace)
    ;
    if ((bool)uVar1) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT17(uVar1,in_stack_ffffffffffffff58),in_stack_ffffffffffffff50);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)
                 CONCAT17(uVar1,in_stack_ffffffffffffff58),in_stack_ffffffffffffff50);
      in_stack_ffffffffffffff38 = 1;
      source_file_00._M_str = pcVar2;
      source_file_00._M_len = in_stack_fffffffffffffff0;
      LogPrintFormatInternal<std::__cxx11::string>
                (in_stack_00000000,source_file_00,in_stack_ffffffffffffffac,
                 in_stack_ffffffffffffffa0,in_stack_000000e0,in_stack_ffffffffffffffe8,
                 in_stack_000000f0);
    }
  }
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
  if (*(char **)(in_FS_OFFSET + 0x28) != pcVar2) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void Log(const std::string& msg)
    {
        const std::string full_msg = this->LogMsg(msg);

        if (m_log_category == BCLog::LogFlags::ALL) {
            LogPrintf("%s\n", full_msg);
        } else {
            LogDebug(m_log_category, "%s\n", full_msg);
        }
    }